

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_hpf_init(ma_hpf_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                     ma_hpf *pHPF)

{
  ma_result mVar1;
  void *pHeap;
  ma_hpf_heap_layout heapLayout;
  ma_hpf_heap_layout local_40;
  
  mVar1 = ma_hpf_get_heap_layout(pConfig,&local_40);
  if (mVar1 == MA_SUCCESS) {
    if (local_40.sizeInBytes == 0) {
      pHeap = (void *)0x0;
    }
    else {
      if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
        pHeap = malloc(local_40.sizeInBytes);
      }
      else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
        pHeap = (void *)0x0;
      }
      else {
        pHeap = (*pAllocationCallbacks->onMalloc)
                          (local_40.sizeInBytes,pAllocationCallbacks->pUserData);
      }
      if (pHeap == (void *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    if (pHPF == (ma_hpf *)0x0) {
      mVar1 = MA_INVALID_ARGS;
    }
    else {
      pHPF->pHPF2 = (ma_hpf2 *)0x0;
      pHPF->_pHeap = (void *)0x0;
      *(undefined8 *)&pHPF->hpf2Count = 0;
      pHPF->pHPF1 = (ma_hpf1 *)0x0;
      pHPF->format = ma_format_unknown;
      pHPF->channels = 0;
      pHPF->sampleRate = 0;
      pHPF->hpf1Count = 0;
      *(undefined8 *)&pHPF->_ownsHeap = 0;
      mVar1 = ma_hpf_reinit__internal(pConfig,pHeap,pHPF,1);
    }
    if (mVar1 == MA_SUCCESS) {
      pHPF->_ownsHeap = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_hpf_init(const ma_hpf_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_hpf* pHPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_hpf_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_hpf_init_preallocated(pConfig, pHeap, pHPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pHPF->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}